

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_TestShell::
TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_TestShell
          (TEST_DoublingFactorCounterTest_TerminalOrHonorInEachSet_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_001d80e0;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, TerminalOrHonorInEachSet)
{
	addPair(Tile::WhiteDragon);
	addTriplet(Tile::WestWind, false);
	addTriplet(Tile::OneOfCharacters, false);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::SevenOfBamboos, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(2, r.doubling_factor);
}